

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O2

void __thiscall iqxmlrpc::Server::schedule_execute(Server *this,Packet *pkt,Server_connection *conn)

{
  Auth_Plugin_base *this_00;
  Executor_factory_base *pEVar1;
  bool bVar2;
  int iVar3;
  Request_header *this_01;
  Packet *pPVar4;
  Request *pRVar5;
  Method *pMVar6;
  undefined4 extraout_var;
  Unauthorized *pUVar8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  authname;
  Data mdata;
  scoped_ptr<iqxmlrpc::http::Packet> packet;
  scoped_ptr<iqxmlrpc::Request> req;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  long *plVar7;
  
  this_00 = this->impl->auth_plugin;
  packet.px = pkt;
  if (this_00 != (Auth_Plugin_base *)0x0) {
    this_01 = (Request_header *)
              __dynamic_cast((pkt->header_).px,&http::Header::typeinfo,
                             &http::Request_header::typeinfo);
    if (this_01 == (Request_header *)0x0) {
      __cxa_bad_cast();
    }
    bVar2 = http::Request_header::has_authinfo(this_01);
    if (bVar2) {
      mdata.method_name._M_dataplus._M_p = (pointer)&mdata.method_name.field_2;
      mdata.method_name._M_string_length = 0;
      mdata.method_name.field_2._M_local_buf[0] = '\0';
      req.px = (Request *)&local_40;
      local_40._M_local_buf[0] = '\0';
      http::Request_header::get_authinfo(this_01,&mdata.method_name,(string *)&req);
      bVar2 = Auth_Plugin_base::authenticate(this_00,&mdata.method_name,(string *)&req);
      if (!bVar2) {
        pUVar8 = (Unauthorized *)__cxa_allocate_exception(0x50);
        http::Unauthorized::Unauthorized(pUVar8);
        __cxa_throw(pUVar8,&http::Unauthorized::typeinfo,http::Error_response::~Error_response);
      }
      boost::optional_detail::
      optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::optional_base(&authname.super_type,&mdata);
      std::__cxx11::string::~string((string *)&req);
      std::__cxx11::string::~string((string *)&mdata);
      goto LAB_00176647;
    }
    bVar2 = Auth_Plugin_base::authenticate_anonymous(this_00);
    if (!bVar2) {
      pUVar8 = (Unauthorized *)__cxa_allocate_exception(0x50);
      http::Unauthorized::Unauthorized(pUVar8);
      __cxa_throw(pUVar8,&http::Unauthorized::typeinfo,http::Error_response::~Error_response);
    }
  }
  authname.super_type.m_initialized = false;
LAB_00176647:
  pPVar4 = boost::scoped_ptr<iqxmlrpc::http::Packet>::operator->(&packet);
  req.px = parse_request(&pPVar4->content_);
  pRVar5 = boost::scoped_ptr<iqxmlrpc::Request>::operator->(&req);
  std::__cxx11::string::string((string *)&mdata,(string *)pRVar5);
  mdata.peer_addr._vptr_Inet_addr = (_func_int **)&PTR__Inet_addr_0019be08;
  mdata.peer_addr.impl_.px = (conn->peer_addr).impl_.px;
  mdata.peer_addr.impl_.pn.pi_ = (conn->peer_addr).impl_.pn.pi_;
  if (mdata.peer_addr.impl_.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (mdata.peer_addr.impl_.pn.pi_)->use_count_ = (mdata.peer_addr.impl_.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  mdata.server_face.server_ = this;
  pMVar6 = Method_dispatcher_manager::create_method(&this->impl->disp_manager,&mdata);
  if (authname.super_type.m_initialized == true) {
    boost::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
              (&authname);
    std::__cxx11::string::_M_assign((string *)&pMVar6->authname_);
  }
  http::Header::get_xheaders((pkt->header_).px,&pMVar6->xheaders_);
  pEVar1 = this->impl->exec_factory;
  iVar3 = (*pEVar1->_vptr_Executor_factory_base[2])(pEVar1,pMVar6,this,conn);
  plVar7 = (long *)CONCAT44(extraout_var,iVar3);
  plVar7[2] = (long)(this->impl->interceptors)._M_ptr;
  pRVar5 = boost::scoped_ptr<iqxmlrpc::Request>::operator->(&req);
  (**(code **)(*plVar7 + 0x10))(plVar7,&pRVar5->params);
  Method::Data::~Data(&mdata);
  boost::checked_delete<iqxmlrpc::Request>(req.px);
  boost::optional_detail::
  optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional_base(&authname.super_type);
  if (packet.px != (Packet *)0x0) {
    (*(packet.px)->_vptr_Packet[1])();
  }
  return;
}

Assistant:

void Server::schedule_execute( http::Packet* pkt, Server_connection* conn )
{
  using boost::scoped_ptr;
  using boost::optional;

  Executor* executor = 0;

  try {
    scoped_ptr<http::Packet> packet(pkt);
    optional<std::string> authname = authenticate(*pkt, impl->auth_plugin);
    scoped_ptr<Request> req( parse_request(packet->content()) );

    Method::Data mdata = {
      req->get_name(),
      conn->get_peer_addr(),
      Server_feedback(this)
    };

    Method* meth = impl->disp_manager.create_method( mdata );

    if (authname)
      meth->authname(authname.get());

    pkt->header()->get_xheaders(meth->xheaders());

    executor = impl->exec_factory->create( meth, this, conn );
    executor->set_interceptors(impl->interceptors.get());
    executor->execute( req->get_params() );
  }
  catch( const iqxmlrpc::http::Error_response& e )
  {
    log_err_msg( e.what() );
    std::auto_ptr<Executor> executor_to_delete(executor);
    http::Packet *pkt = new http::Packet(e);
    conn->schedule_response( pkt );
  }
  catch( const iqxmlrpc::Exception& e )
  {
    log_err_msg( std::string("Server: ") + e.what() );
    Response err_r( e.code(), e.what() );
    schedule_response( err_r, conn, executor );
  }
  catch( const std::exception& e )
  {
    log_err_msg( std::string("Server: ") + e.what() );
    Response err_r( -32500 /*application error*/, e.what() );
    schedule_response( err_r, conn, executor );
  }
  catch( ... )
  {
    log_err_msg( "Server: Unknown exception" );
    Response err_r( -32500  /*application error*/, "Unknown Error" );
    schedule_response( err_r, conn, executor );
  }
}